

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  undefined1 auVar1 [64];
  mz_uint32 mVar2;
  mz_zip_internal_state *pmVar3;
  mz_uint64 mVar4;
  undefined4 uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  mz_uint64 mVar11;
  mz_uint64 mVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined4 uStack_128;
  undefined1 auStack_124 [44];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    return 0;
  }
  if (pmVar3->m_zip64 == 0) {
    if ((0xffff < pZip->m_total_files) ||
       ((pZip->m_archive_size + (pmVar3->m_central_dir).m_size) - 0xffffffea < 0xffffffff00000000))
    goto LAB_001177e0;
  }
  else if (0xfffffffe < (pmVar3->m_central_dir).m_size) {
LAB_001177e0:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (pZip->m_total_files == 0) {
    mVar12 = 0;
    sVar8 = 0;
  }
  else {
    mVar12 = pZip->m_archive_size;
    sVar8 = (pmVar3->m_central_dir).m_size;
    pZip->m_central_directory_file_ofs = mVar12;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar12,(pmVar3->m_central_dir).m_p,sVar8);
    if (sVar7 != sVar8) goto LAB_00117a9e;
    pZip->m_archive_size = pZip->m_archive_size + sVar8;
  }
  if (pmVar3->m_zip64 != 0) {
    mVar4 = pZip->m_archive_size;
    local_78 = ZEXT1664(ZEXT816(0));
    local_b8 = ZEXT1664(ZEXT816(0));
    local_f8 = ZEXT1664(ZEXT816(0));
    uStack_130 = 0x2d031e00000000;
    local_138 = (undefined1  [8])0x2c06064b50;
    mVar2 = pZip->m_total_files;
    _uStack_128 = 0;
    auStack_124[4] = (char)mVar2;
    auStack_124[5] = (undefined1)(mVar2 >> 8);
    auStack_124[6] = (undefined1)(mVar2 >> 0x10);
    auStack_124[7] = (undefined1)(mVar2 >> 0x18);
    auStack_124._8_4_ = 0;
    auStack_124[0xc] = (char)mVar2;
    auStack_124[0xd] = auStack_124[5];
    auStack_124[0xe] = auStack_124[6];
    auStack_124[0xf] = auStack_124[7];
    auStack_124._16_4_ = 0;
    auStack_124[0x14] = (char)sVar8;
    auVar14 = vpbroadcastq_avx512vl();
    auVar15 = vpmovsxbq_avx2(ZEXT416(0x20181008));
    auVar14 = vpsrlvq_avx2(auVar14,auVar15);
    auVar13 = vpmovqb_avx512vl(auVar14);
    auStack_124._21_4_ = auVar13._0_4_;
    auStack_124[0x19] = (char)(sVar8 >> 0x28);
    auStack_124[0x1a] = (char)(sVar8 >> 0x30);
    auStack_124[0x1b] = (char)(sVar8 >> 0x38);
    auStack_124[0x1c] = (char)mVar12;
    auVar14 = vpbroadcastq_avx512vl();
    auVar15 = vpsrlvq_avx2(auVar14,auVar15);
    auVar13 = vpmovqb_avx512vl(auVar15);
    auStack_124._29_4_ = auVar13._0_4_;
    auStack_124[0x21] = (char)(mVar12 >> 0x28);
    auStack_124[0x22] = (char)(mVar12 >> 0x30);
    auStack_124[0x23] = (char)(mVar12 >> 0x38);
    auStack_124._36_8_ = 0;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar4,local_138,0x38);
    if (sVar7 != 0x38) {
LAB_00117aa9:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar11 = pZip->m_archive_size + 0x38;
    pZip->m_archive_size = mVar11;
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar16);
    local_78 = vmovdqu64_avx512f(auVar16);
    local_b8 = vmovdqu64_avx512f(auVar16);
    local_f8 = vmovdqu64_avx512f(auVar16);
    stack0xfffffffffffffecc = auVar1._4_60_;
    local_138._0_4_ = 0x7064b50;
    uStack_130._0_1_ = (char)mVar4;
    auVar15 = vpbroadcastq_avx512vl();
    auVar15 = vpsrlvq_avx2(auVar15,_DAT_0015a040);
    auVar13 = vpmovqb_avx512vl(auVar15);
    uStack_130._1_4_ = auVar13._0_4_;
    uStack_130._5_1_ = (char)(mVar4 >> 0x28);
    uStack_130._6_1_ = (char)(mVar4 >> 0x30);
    uStack_130._7_1_ = (char)(mVar4 >> 0x38);
    auStack_124 = auVar1._20_44_;
    uStack_128 = 1;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar11,local_138,0x14);
    if (sVar7 != 0x14) goto LAB_00117aa9;
    pZip->m_archive_size = pZip->m_archive_size + 0x14;
  }
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar16);
  local_78 = vmovdqu64_avx512f(auVar16);
  local_b8 = vmovdqu64_avx512f(auVar16);
  local_f8 = vmovdqu64_avx512f(auVar16);
  stack0xfffffffffffffecc = auVar1._4_60_;
  local_138._0_4_ = 0x6054b50;
  uVar9 = 0xffff;
  if (pZip->m_total_files < 0xffff) {
    uVar9 = pZip->m_total_files;
  }
  uStack_130._0_1_ = (char)uVar9;
  uStack_130._1_1_ = (undefined1)(uVar9 >> 8);
  uStack_130._2_1_ = (char)uVar9;
  uStack_130._3_1_ = uStack_130._1_1_;
  uVar5 = (undefined4)sVar8;
  if (0xfffffffe < sVar8) {
    uVar5 = 0xffffffff;
  }
  uStack_130._4_1_ = (char)uVar5;
  uStack_130._5_1_ = (char)((uint)uVar5 >> 8);
  uStack_130._6_1_ = (char)((uint)uVar5 >> 0x10);
  uStack_130._7_1_ = (char)((uint)uVar5 >> 0x18);
  uVar10 = 0xffffffff;
  if (mVar12 < 0xffffffff) {
    uVar10 = mVar12;
  }
  uStack_128._0_1_ = (char)uVar10;
  uStack_128._1_1_ = (char)(uVar10 >> 8);
  uStack_128._2_1_ = (char)(uVar10 >> 0x10);
  auStack_124 = auVar1._20_44_;
  uStack_128._3_1_ = (char)(uVar10 >> 0x18);
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,local_138,0x16);
  if (sVar8 == 0x16) {
    if (((FILE *)pmVar3->m_pFile != (FILE *)0x0) &&
       (iVar6 = fflush((FILE *)pmVar3->m_pFile), iVar6 == -1)) {
      pZip->m_last_error = MZ_ZIP_FILE_CLOSE_FAILED;
      return 0;
    }
    pZip->m_archive_size = pZip->m_archive_size + 0x16;
    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return 1;
  }
LAB_00117a9e:
  pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_finalize_archive(mz_zip_archive* pZip) {

    mz_zip_internal_state* pState;
    mz_uint64 central_dir_ofs, central_dir_size;
    mz_uint8 hdr[256];

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64) {
        if ((pZip->m_total_files > MZ_UINT32_MAX) || (pState->m_central_dir.m_size >= MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        if ((pZip->m_total_files > MZ_UINT16_MAX)
                || ((pZip->m_archive_size + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
                        > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    central_dir_ofs = 0;
    central_dir_size = 0;
    if (pZip->m_total_files) {
        /* Write central directory */
        central_dir_ofs = pZip->m_archive_size;
        central_dir_size = pState->m_central_dir.m_size;
        pZip->m_central_directory_file_ofs = central_dir_ofs;
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           central_dir_ofs,
                           pState->m_central_dir.m_p,
                           (size_t)central_dir_size) != central_dir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += central_dir_size;
    }

    if (pState->m_zip64) {
        /* Write zip64 end of central directory header */
        mz_uint64 rel_ofs_to_zip64_ecdr = pZip->m_archive_size;

        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDH_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - sizeof(mz_uint32) - sizeof(mz_uint64));
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_MADE_BY_OFS, 0x031E); /* TODO: always Unix */
        MZ_WRITE_LE16(hdr + MZ_ZIP64_ECDH_VERSION_NEEDED_OFS, 0x002D);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_SIZE_OFS, central_dir_size);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDH_CDIR_OFS_OFS, central_dir_ofs);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

        /* Write zip64 end of central directory locator */
        MZ_CLEAR_OBJ(hdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_SIG_OFS, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG);
        MZ_WRITE_LE64(hdr + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS, rel_ofs_to_zip64_ecdr);
        MZ_WRITE_LE32(hdr + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS, 1);
        if (pZip->m_pWrite(pZip->m_pIO_opaque,
                           pZip->m_archive_size,
                           hdr,
                           MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) != MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        pZip->m_archive_size += MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
    }

    /* Write end of central directory record */
    MZ_CLEAR_OBJ(hdr);
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, MZ_MIN(MZ_UINT16_MAX, pZip->m_total_files));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_size));
    MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, MZ_MIN(MZ_UINT32_MAX, central_dir_ofs));

    if (pZip->m_pWrite(pZip->m_pIO_opaque,
                       pZip->m_archive_size,
                       hdr,
                       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

#ifndef MINIZ_NO_STDIO
    if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_CLOSE_FAILED);
#endif /* #ifndef MINIZ_NO_STDIO */

    pZip->m_archive_size += MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE;

    pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
    return MZ_TRUE;
}